

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

void N_VSpace_ManyVector(N_Vector v,sunindextype *lrw,sunindextype *liw)

{
  long lVar1;
  long lVar2;
  sunindextype liw1;
  sunindextype lrw1;
  long local_40;
  long local_38;
  
  *lrw = 0;
  *liw = 0;
  for (lVar2 = 0; lVar2 < *v->content; lVar2 = lVar2 + 1) {
    lVar1 = *(long *)(*(long *)((long)v->content + 0x10) + lVar2 * 8);
    if (*(long *)(*(long *)(lVar1 + 8) + 0x20) != 0) {
      N_VSpace(lVar1,&local_38,&local_40);
      *lrw = *lrw + local_38;
      *liw = *liw + local_40;
    }
  }
  return;
}

Assistant:

void MVAPPEND(N_VSpace)(N_Vector v, sunindextype* lrw, sunindextype* liw)
{
  SUNFunctionBegin(v->sunctx);
  sunindextype i, lrw1, liw1;
  *lrw = 0;
  *liw = 0;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(v); i++)
  {
    /* update space requirements for this subvector (if 'nvspace' is implemented) */
    if ((MANYVECTOR_SUBVEC(v, i))->ops->nvspace != NULL)
    {
      N_VSpace(MANYVECTOR_SUBVEC(v, i), &lrw1, &liw1);
      SUNCheckLastErrVoid();
      *lrw += lrw1;
      *liw += liw1;
    }
  }
  return;
}